

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RecordManager.cpp
# Opt level: O1

void __thiscall
RecordManager::LoadAllRecordSet
          (RecordManager *this,vector<TableInfo,_std::allocator<TableInfo>_> *Ts)

{
  long *plVar1;
  ulong uVar2;
  size_type *psVar3;
  ulong uVar4;
  pointer pTVar5;
  long lVar6;
  string filename;
  RecordSet NewRS;
  TableInfo T;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_240;
  RecordManager *local_220;
  string local_218;
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,RecordSet>,std::_Select1st<std::pair<std::__cxx11::string_const,RecordSet>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,RecordSet>>>
  *local_1f8;
  vector<TableInfo,_std::allocator<TableInfo>_> *local_1f0;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_RecordSet>
  local_1e8;
  RecordSet local_168;
  TableInfo local_108;
  
  pTVar5 = (Ts->super__Vector_base<TableInfo,_std::allocator<TableInfo>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if ((Ts->super__Vector_base<TableInfo,_std::allocator<TableInfo>_>)._M_impl.
      super__Vector_impl_data._M_finish != pTVar5) {
    local_1f8 = (_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,RecordSet>,std::_Select1st<std::pair<std::__cxx11::string_const,RecordSet>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,RecordSet>>>
                 *)&this->Total_Record;
    lVar6 = 0;
    uVar4 = 0;
    local_220 = this;
    local_1f0 = Ts;
    do {
      TableInfo::TableInfo
                (&local_108,(TableInfo *)((long)&(pTVar5->tableName)._M_dataplus._M_p + lVar6));
      std::operator+(&local_1e8.first,&local_220->Direction,&local_108.tableName);
      plVar1 = (long *)std::__cxx11::string::append((char *)&local_1e8);
      local_240._M_dataplus._M_p = (pointer)&local_240.field_2;
      psVar3 = (size_type *)(plVar1 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar1 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar3) {
        local_240.field_2._M_allocated_capacity = *psVar3;
        local_240.field_2._8_8_ = plVar1[3];
      }
      else {
        local_240.field_2._M_allocated_capacity = *psVar3;
        local_240._M_dataplus._M_p = (pointer)*plVar1;
      }
      local_240._M_string_length = plVar1[1];
      *plVar1 = (long)psVar3;
      plVar1[1] = 0;
      *(undefined1 *)(plVar1 + 2) = 0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1e8.first._M_dataplus._M_p != &local_1e8.first.field_2) {
        operator_delete(local_1e8.first._M_dataplus._M_p,
                        local_1e8.first.field_2._M_allocated_capacity + 1);
      }
      local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_218,local_240._M_dataplus._M_p,
                 local_240._M_dataplus._M_p + local_240._M_string_length);
      RecordSet::RecordSet(&local_168,&local_218);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_218._M_dataplus._M_p != &local_218.field_2) {
        operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
      }
      std::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_RecordSet>
      ::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_RecordSet_&,_true>
                (&local_1e8,&local_240,&local_168);
      std::
      _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,RecordSet>,std::_Select1st<std::pair<std::__cxx11::string_const,RecordSet>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,RecordSet>>>
      ::_M_emplace_unique<std::pair<std::__cxx11::string,RecordSet>>(local_1f8,&local_1e8);
      if (local_1e8.second.TypeTable.super__Vector_base<char,_std::allocator<char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_1e8.second.TypeTable.super__Vector_base<char,_std::allocator<char>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_1e8.second.TypeTable.
                              super__Vector_base<char,_std::allocator<char>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_1e8.second.TypeTable.
                              super__Vector_base<char,_std::allocator<char>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      if (local_1e8.second.FreeAddr.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_1e8.second.FreeAddr.super__Vector_base<Addr,_std::allocator<Addr>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_1e8.second.FreeAddr.
                              super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_1e8.second.FreeAddr.
                              super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1e8.second.Record_FileName._M_dataplus._M_p !=
          &local_1e8.second.Record_FileName.field_2) {
        operator_delete(local_1e8.second.Record_FileName._M_dataplus._M_p,
                        local_1e8.second.Record_FileName.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1e8.first._M_dataplus._M_p != &local_1e8.first.field_2) {
        operator_delete(local_1e8.first._M_dataplus._M_p,
                        local_1e8.first.field_2._M_allocated_capacity + 1);
      }
      if (local_168.TypeTable.super__Vector_base<char,_std::allocator<char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_168.TypeTable.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_168.TypeTable.super__Vector_base<char,_std::allocator<char>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_168.TypeTable.super__Vector_base<char,_std::allocator<char>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      if (local_168.FreeAddr.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_168.FreeAddr.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_168.FreeAddr.super__Vector_base<Addr,_std::allocator<Addr>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_168.FreeAddr.super__Vector_base<Addr,_std::allocator<Addr>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_168.Record_FileName._M_dataplus._M_p != &local_168.Record_FileName.field_2) {
        operator_delete(local_168.Record_FileName._M_dataplus._M_p,
                        local_168.Record_FileName.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_240._M_dataplus._M_p != &local_240.field_2) {
        operator_delete(local_240._M_dataplus._M_p,local_240.field_2._M_allocated_capacity + 1);
      }
      std::
      _Rb_tree<int,_std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~_Rb_tree(&local_108.indexInfo._M_t);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
      ::~_Rb_tree(&local_108.getID._M_t);
      if (local_108.constraint.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_108.constraint.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_108.constraint.super__Vector_base<int,_std::allocator<int>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_108.constraint.super__Vector_base<int,_std::allocator<int>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      if (local_108.type.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_108.type.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_108.type.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_108.type.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_108.attributeName);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_108.tableName._M_dataplus._M_p != &local_108.tableName.field_2) {
        operator_delete(local_108.tableName._M_dataplus._M_p,
                        local_108.tableName.field_2._M_allocated_capacity + 1);
      }
      uVar4 = uVar4 + 1;
      pTVar5 = (local_1f0->super__Vector_base<TableInfo,_std::allocator<TableInfo>_>)._M_impl.
               super__Vector_impl_data._M_start;
      uVar2 = ((long)(local_1f0->super__Vector_base<TableInfo,_std::allocator<TableInfo>_>)._M_impl.
                     super__Vector_impl_data._M_finish - (long)pTVar5 >> 3) * -0x7b425ed097b425ed;
      lVar6 = lVar6 + 0xd8;
    } while (uVar4 <= uVar2 && uVar2 - uVar4 != 0);
  }
  return;
}

Assistant:

void RecordManager::LoadAllRecordSet(vector<TableInfo> Ts) {
	int i;
	for (i = 0; i < Ts.size(); i++) {
		TableInfo T = Ts.at(i);
		string filename = Direction + T.tableName + "_rcd.dat";
		RecordSet NewRS = RecordSet(filename);
		this->Total_Record.insert(pair<string, RecordSet>(filename, NewRS));
	}
}